

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2pbf.cpp
# Opt level: O0

void pbrt::semantic::usage(string *msg)

{
  bool bVar1;
  void *this;
  ostream *poVar2;
  string *in_RDI;
  
  bVar1 = std::operator!=(msg,(char *)in_RDI);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar2 = std::operator<<(poVar2,in_RDI);
    this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"./pbrt2pbf inFile.pbrt|inFile.pbf <args>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  -o <out.pbf>   : where to write the output to");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "                   (tris to quads, removing reundant fields, etc)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator==(msg,(char *)in_RDI);
  exit((uint)!bVar1);
}

Assistant:

void usage(const std::string &msg)
    {
      if (msg != "") std::cerr << "Error: " << msg << std::endl << std::endl;
      std::cout << "./pbrt2pbf inFile.pbrt|inFile.pbf <args>" << std::endl;
      std::cout << std::endl;
      std::cout << "  -o <out.pbf>   : where to write the output to" << std::endl;
      std::cout << "                   (tris to quads, removing reundant fields, etc)" << std::endl;
      std::cout << std::endl;
      exit(msg == "" ? 0 : 1);
    }